

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O0

long __thiscall OS_Counter::inc(OS_Counter *this)

{
  long lVar1;
  OS_Counter *this_local;
  
  LOCK();
  lVar1 = (this->cnt).super___atomic_base<long>._M_i;
  (this->cnt).super___atomic_base<long>._M_i = (this->cnt).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return lVar1 + 1;
}

Assistant:

long inc()
    {
#ifdef ATOMIC_TYPE
        return ATOMIC_INC_FETCH(cnt);
#else
        /* do the inc-and-fetch with a spin lock to make it atomic */
        pthread_spin_lock(&lock);
        long newval = ++cnt;
        pthread_spin_unlock(&lock);

        /* return the updated value */
        return newval;
#endif
    }